

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O1

SourceResultType __thiscall
duckdb::RadixHTGlobalSourceState::AssignTask
          (RadixHTGlobalSourceState *this,RadixHTGlobalSinkState *sink,
          RadixHTLocalSourceState *lstate,InterruptState *interrupt_state)

{
  AggregatePartitionState AVar1;
  size_type __n;
  _Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false> _Var2;
  undefined1 uVar3;
  reference this_00;
  type pAVar4;
  InternalException *this_01;
  long lVar5;
  SourceResultType SVar6;
  unique_lock<std::mutex> partition_guard;
  unique_lock<std::mutex> guard;
  unique_lock<std::mutex> local_70;
  unique_lock<std::mutex> local_60;
  string local_50;
  
  local_60._M_device = &(sink->super_GlobalSinkState).super_StateWithBlockableTasks.lock;
  local_60._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_60);
  local_60._M_owns = true;
  if ((((this->finished)._M_base._M_i & 1U) != 0) ||
     (__n = this->task_idx,
     __n == (long)(sink->partitions).
                  super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(sink->partitions).
                  super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    _Var2._M_head_impl =
         (lstate->ht).
         super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
         .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl;
    (lstate->ht).
    super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
    .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl =
         (GroupedAggregateHashTable *)0x0;
    SVar6 = FINISHED;
    if (_Var2._M_head_impl != (GroupedAggregateHashTable *)0x0) {
      (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseAggregateHashTable + 8))();
    }
    goto LAB_00f69b82;
  }
  this->task_idx = __n + 1;
  lstate->task_idx = __n;
  this_00 = vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_true>
            ::operator[](&sink->partitions,__n);
  pAVar4 = unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>
           ::operator*(this_00);
  local_70._M_device = &(pAVar4->super_StateWithBlockableTasks).lock;
  local_70._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_70);
  local_70._M_owns = true;
  AVar1 = pAVar4->state;
  if (AVar1 == READY_TO_FINALIZE) {
    pAVar4->state = FINALIZE_IN_PROGRESS;
    uVar3 = 1;
    lVar5 = 8;
LAB_00f69b73:
    *(undefined1 *)((long)&(lstate->super_LocalSourceState)._vptr_LocalSourceState + lVar5) = uVar3;
    SVar6 = HAVE_MORE_OUTPUT;
  }
  else {
    if (AVar1 != FINALIZE_IN_PROGRESS) {
      if (AVar1 != READY_TO_SCAN) {
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   "Unexpected AggregatePartitionState in RadixHTLocalSourceState::Finalize!","");
        InternalException::InternalException(this_01,&local_50);
        __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      lstate->task = SCAN;
      lVar5 = 0x20;
      uVar3 = 0;
      goto LAB_00f69b73;
    }
    lstate->task = SCAN;
    lstate->scan_status = INIT;
    SVar6 = FINISHED;
    if (((pAVar4->super_StateWithBlockableTasks).can_block._M_base._M_i & 1U) != 0) {
      SVar6 = BLOCKED;
      ::std::vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>::push_back
                (&(pAVar4->super_StateWithBlockableTasks).blocked_tasks.
                  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>,
                 interrupt_state);
    }
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&local_70);
LAB_00f69b82:
  ::std::unique_lock<std::mutex>::~unique_lock(&local_60);
  return SVar6;
}

Assistant:

SourceResultType RadixHTGlobalSourceState::AssignTask(RadixHTGlobalSinkState &sink, RadixHTLocalSourceState &lstate,
                                                      InterruptState &interrupt_state) {
	// First, try to get a partition index
	auto guard = sink.Lock();
	if (finished || task_idx == sink.partitions.size()) {
		lstate.ht.reset();
		return SourceResultType::FINISHED;
	}
	lstate.task_idx = task_idx++;

	// We got a partition index
	auto &partition = *sink.partitions[lstate.task_idx];
	auto partition_guard = partition.Lock();
	switch (partition.state) {
	case AggregatePartitionState::READY_TO_FINALIZE:
		partition.state = AggregatePartitionState::FINALIZE_IN_PROGRESS;
		lstate.task = RadixHTSourceTaskType::FINALIZE;
		return SourceResultType::HAVE_MORE_OUTPUT;
	case AggregatePartitionState::FINALIZE_IN_PROGRESS:
		lstate.task = RadixHTSourceTaskType::SCAN;
		lstate.scan_status = RadixHTScanStatus::INIT;
		return partition.BlockSource(partition_guard, interrupt_state);
	case AggregatePartitionState::READY_TO_SCAN:
		lstate.task = RadixHTSourceTaskType::SCAN;
		lstate.scan_status = RadixHTScanStatus::INIT;
		return SourceResultType::HAVE_MORE_OUTPUT;
	default:
		throw InternalException("Unexpected AggregatePartitionState in RadixHTLocalSourceState::Finalize!");
	}
}